

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

void get_wall_for_db(int *x,int *y)

{
  int *y_local;
  int *x_local;
  
  switch(*(uint *)&level->locations[*x][*y].field_0x6 >> 4 & 3) {
  case 0:
    *y = *y + -1;
    break;
  case 1:
    *y = *y + 1;
    break;
  case 2:
    *x = *x + 1;
    break;
  case 3:
    *x = *x + -1;
  }
  return;
}

Assistant:

static void get_wall_for_db(int *x, int *y)
{
	switch (level->locations[*x][*y].drawbridgemask & DB_DIR) {
		case DB_NORTH: (*y)--; break;
		case DB_SOUTH: (*y)++; break;
		case DB_EAST:  (*x)++; break;
		case DB_WEST:  (*x)--; break;
	}
}